

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statzone.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  __ssize_t _Var2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar6;
  allocator local_151;
  string local_150 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_130;
  undefined1 local_128;
  rep local_120;
  undefined4 local_118;
  FILE *local_108;
  FILE *zonefile;
  char *token_lc;
  char *token;
  char *rdata;
  string previous_domain;
  string local_c8 [8];
  string domain;
  char *input;
  size_t linesize;
  char *linebuffer;
  int token_count;
  int opt;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_ns;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  signed_domains;
  char **argv_local;
  int argc_local;
  
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&unique_ns._M_h._M_single_bucket);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&token_count);
  linesize = 0;
  input = (char *)0x0;
  std::__cxx11::string::string(local_c8);
  std::__cxx11::string::string((string *)&rdata);
  token_lc = (char *)0x0;
  zonefile = (FILE *)0x0;
  do {
    linebuffer._4_4_ = getopt(argc,argv,"hv");
    if (linebuffer._4_4_ == -1) {
      if (argc <= _optind) {
        usage();
        argv_local._4_4_ = 0;
        goto LAB_00102d1a;
      }
      pcVar3 = argv[_optind];
      begin.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_120 = (rep)begin.__d.__r;
      iVar1 = strcmp(pcVar3,"-");
      if (iVar1 == 0) {
        local_108 = _stdin;
        goto LAB_0010263a;
      }
      local_108 = fopen(pcVar3,"r");
      if (local_108 == (FILE *)0x0) {
        perror("Can\'t open zone file");
        argv_local._4_4_ = 1;
      }
      else {
LAB_0010263a:
        while (_Var2 = getline((char **)&linesize,(size_t *)&input,local_108), _Var2 != -1) {
          if (((*(char *)linesize != '\0') && (*(char *)linesize != ';')) &&
             (*(char *)linesize != '$')) {
            linebuffer._0_4_ = 0;
            token_lc = strtok((char *)linesize," \t");
            if (token_lc != (char *)0x0) {
              pcVar3 = strtolower(token_lc);
              std::__cxx11::string::operator=(local_c8,pcVar3);
            }
            while (token_lc != (char *)0x0) {
              if (*token_lc == ';') {
                token_lc = (char *)0x0;
              }
              else {
                zonefile = (FILE *)strtolower(token_lc);
                if (((int)linebuffer == 0) || (iVar1 = strcmp((char *)zonefile,"nsec"), iVar1 != 0))
                {
                  if (((int)linebuffer == 0) ||
                     (iVar1 = strcmp((char *)zonefile,"nsec3"), iVar1 != 0)) {
                    if (((int)linebuffer == 0) ||
                       (iVar1 = strcmp((char *)zonefile,"rrsig"), iVar1 != 0)) {
                      if (((int)linebuffer != 0) &&
                         (iVar1 = strcmp((char *)zonefile,"a"), iVar1 == 0)) {
                        results.a = results.a + 1;
                      }
                      if (((int)linebuffer != 0) &&
                         (iVar1 = strcmp((char *)zonefile,"aaaa"), iVar1 == 0)) {
                        results.aaaa = results.aaaa + 1;
                      }
                      if (((int)linebuffer != 0) &&
                         (iVar1 = strcmp((char *)zonefile,"ds"), iVar1 == 0)) {
                        results.ds = results.ds + 1;
                        pVar6 = std::
                                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&unique_ns._M_h._M_single_bucket,(value_type *)local_c8)
                        ;
                        local_130._M_cur =
                             (__node_type *)
                             pVar6.first.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             ._M_cur;
                        local_128 = pVar6.second;
                      }
                      iVar1 = strcmp((char *)zonefile,"ns");
                      if (iVar1 == 0) {
                        results.ns = results.ns + 1;
                        iVar1 = std::__cxx11::string::compare(local_c8);
                        if (iVar1 != 0) {
                          results.domains = results.domains + 1;
                          std::__cxx11::string::operator=((string *)&rdata,local_c8);
                          iVar1 = std::__cxx11::string::compare((ulong)local_c8,0,(char *)0x4);
                          if (iVar1 == 0) {
                            results.idn = results.idn + 1;
                          }
                        }
                        token = strtok((char *)0x0,"\n");
                        if ((token != (char *)0x0) &&
                           (pcVar3 = strchr(token,0x20), pcVar3 != (char *)0x0)) {
                          token = strtok((char *)0x0,"\n");
                        }
                        pcVar3 = token;
                        if (token != (char *)0x0) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_150,pcVar3,&local_151);
                          std::
                          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&token_count,(value_type *)local_150);
                          std::__cxx11::string::~string(local_150);
                          std::allocator<char>::~allocator((allocator<char> *)&local_151);
                        }
                      }
                      token_lc = strtok((char *)0x0," \t");
                      linebuffer._0_4_ = (int)linebuffer + 1;
                    }
                    else {
                      token_lc = (char *)0x0;
                    }
                  }
                  else {
                    token_lc = (char *)0x0;
                  }
                }
                else {
                  token_lc = (char *)0x0;
                }
              }
            }
            results.processedLines = results.processedLines + 1;
          }
        }
        if (results.domains != 0) {
          results.domains = results.domains - 1;
        }
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "---[ CSV values ]--------------------------------------------------------------"
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "IPv4 Glue,IPv6 Glue,NS,Unique NS,DS,Signed,IDNs,Domains");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,results.a);
        std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,results.aaaa);
        std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,results.ns);
        std::operator<<(poVar4,",");
        sVar5 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&token_count);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar5);
        std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,results.ds);
        std::operator<<(poVar4,",");
        sVar5 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&unique_ns._M_h._M_single_bucket);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar5);
        std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,results.idn);
        std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,results.domains);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        summary();
        free((void *)linesize);
        fclose(local_108);
        argv_local._4_4_ = 0;
      }
      goto LAB_00102d1a;
    }
    if (linebuffer._4_4_ == 0x68) {
      usage();
      argv_local._4_4_ = 0;
      goto LAB_00102d1a;
    }
  } while (linebuffer._4_4_ != 0x76);
  printf("%s\n","StatZone 1.1.2");
  argv_local._4_4_ = 0;
LAB_00102d1a:
  local_118 = 1;
  std::__cxx11::string::~string((string *)&rdata);
  std::__cxx11::string::~string(local_c8);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&token_count);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&unique_ns._M_h._M_single_bucket);
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
	std::unordered_set<std::string> signed_domains;
	std::unordered_set<std::string> unique_ns;

	int opt, token_count;

	char *linebuffer = NULL;
	size_t linesize = 0;

	char *input;
	std::string domain, previous_domain;
	char *rdata, *token = nullptr, *token_lc = nullptr;

	FILE *zonefile;

#ifdef HAVE_SECCOMP
	if (prctl(PR_SET_NO_NEW_PRIVS, 1, 0, 0, 0)) {
		perror("Can't initialize seccomp");
		return EXIT_FAILURE;
	}

	if (prctl(PR_SET_SECCOMP, SECCOMP_MODE_FILTER, &statzone)) {
		perror("Can't load seccomp filter");
		return EXIT_FAILURE;
	}
#endif

#ifdef SIGINFO
	signal(SIGINFO, siginfo_handler);
#endif

	while ((opt = getopt(argc, argv, "hv")) != -1) {
		switch (opt) {

		case 'h':
			usage();
			return EXIT_SUCCESS;

		case 'v':
			printf("%s\n", VERSION);
			return EXIT_SUCCESS;
		}
	}

	if (optind < argc) {
		input = argv[optind];
	} else {
		usage();
		return EXIT_SUCCESS;
	}

	/* Starting timer */
	begin = std::chrono::steady_clock::now();

	/* Open zone file */
	if (!strcmp(input, "-")) {
		/* Read from standard input */
		zonefile = stdin;
	} else {
		/* Attempt to read from file */
		if (!(zonefile = fopen(input, "r"))) {
			perror("Can't open zone file");
			return EXIT_FAILURE;
		}
	}

	while (getline(&linebuffer, &linesize, zonefile) != -1) {
		if (!*linebuffer)
			continue;

		if (*linebuffer == ';') /* Comments */
			continue;

		if (*linebuffer == '$') /* Directives */
			continue;

		token_count = 0;
		token = strtok(linebuffer, " \t");

		if (token)
			domain = strtolower(token);

		while (token) {
			if (*token == ';') { /* Comments */
				token = nullptr;
				continue;
			}

			token_lc = strtolower(token);
			if (token_count && !strcmp(token_lc, "nsec")) {
				token = nullptr;
				continue;
			}

			if (token_count && !strcmp(token_lc, "nsec3")) {
				token = nullptr;
				continue;
			}

			if (token_count && !strcmp(token_lc, "rrsig")) {
				token = nullptr;
				continue;
			}

			if (token_count && !strcmp(token_lc, "a"))
				results.a++;

			if (token_count && !strcmp(token_lc, "aaaa"))
				results.aaaa++;

			if (token_count && !strcmp(token_lc, "ds")) {
				results.ds++;

				signed_domains.insert(domain);
			}

			if (!strcmp(token_lc, "ns")) {
				results.ns++;

				if (domain.compare(previous_domain)) {
					results.domains++;

					previous_domain = domain;

					if (!domain.compare(0, 4, "xn--"))
						results.idn++;
				}

				rdata = strtok(nullptr, "\n");

				if (rdata && strchr(rdata, ' '))
					rdata = strtok(nullptr, "\n");

				if (rdata)
					unique_ns.insert(rdata);
			}

			token = strtok(nullptr, " \t");
			token_count++;
		}

		results.processedLines++;
	}

	/* Don't count origin */
	if (results.domains)
		results.domains--;

	/* Printing CVS values */
	std::cout << "---[ CSV values ]--------------------------------------------------------------" << std::endl;
	std::cout << "IPv4 Glue,IPv6 Glue,NS,Unique NS,DS,Signed,IDNs,Domains" << std::endl;
	std::cout << results.a << ",";
	std::cout << results.aaaa << ",";
	std::cout << results.ns << ",";
	std::cout << unique_ns.size() << ",";
	std::cout << results.ds << ",";
	std::cout << signed_domains.size() << ",";
	std::cout << results.idn << ",";
	std::cout << results.domains << std::endl;

	/* Printing results */
	summary();

	/* Clean up */
	free(linebuffer);
	fclose(zonefile);

	return EXIT_SUCCESS;
}